

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_dehacked.cpp
# Opt level: O3

int DoInclude(int dummy)

{
  char *pcVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  char cVar6;
  bool bVar7;
  int iVar8;
  char *pcVar9;
  size_t sVar10;
  char *__dest;
  char *pcVar11;
  
  pcVar11 = Line2;
  if (including == '\x01') {
    Printf("Sorry, can\'t nest includes\n");
    goto LAB_004b57c3;
  }
  iVar8 = strncasecmp(Line2,"notext",6);
  pcVar5 = Line2;
  if (((iVar8 == 0) && (pcVar11[6] != '\0')) &&
     (iVar8 = isspace((int)pcVar11[6]), pcVar5 = Line2, iVar8 != 0)) {
    includenotext = 1;
    cVar6 = pcVar11[7];
    pcVar11 = pcVar11 + 7;
    while ((pcVar5 = pcVar11, cVar6 != '\0' && (iVar8 = isspace((int)cVar6), iVar8 != 0))) {
      cVar6 = pcVar11[1];
      pcVar11 = pcVar11 + 1;
    }
  }
  Line2 = pcVar5;
  stripwhite(pcVar11);
  cVar6 = *pcVar11;
  if (cVar6 == '\"') {
    Line2 = pcVar11 + 1;
    for (pcVar11 = Line2; (*pcVar11 != '\0' && (*pcVar11 != '\"')); pcVar11 = pcVar11 + 1) {
    }
    *pcVar11 = '\0';
    cVar6 = *Line2;
    pcVar11 = Line2;
  }
  if (cVar6 == '\0') {
    Printf("Include directive is missing filename\n");
  }
  else {
    DPrintf(4,"Including %s\n",pcVar11);
    pcVar4 = PatchPt;
    iVar3 = dversion;
    iVar2 = pversion;
    pcVar1 = PatchFile;
    pcVar5 = PatchName;
    iVar8 = PatchSize;
    including = 1;
    if ((PatchName == (char *)0x0) || (pcVar9 = strrchr(PatchName,0x2f), pcVar9 == (char *)0x0)) {
LAB_004b5767:
      D_LoadDehFile(pcVar11);
    }
    else {
      sVar10 = strlen(pcVar11);
      __dest = (char *)operator_new__((ulong)(pcVar9 + (sVar10 - (long)pcVar5) + 2));
      strncpy(__dest,pcVar5,(size_t)(pcVar9 + (1 - (long)pcVar5)));
      strcpy(__dest + (long)(pcVar9 + (1 - (long)pcVar5)),pcVar11);
      bVar7 = FileExists(__dest);
      if (!bVar7) {
        operator_delete__(__dest);
        goto LAB_004b5767;
      }
      D_LoadDehFile(__dest);
      if (pcVar11 != __dest) {
        operator_delete__(__dest);
      }
    }
    DPrintf(4,"Done with include\n");
    PatchSize = iVar8;
    PatchName = pcVar5;
    PatchFile = pcVar1;
    pversion = iVar2;
    dversion = iVar3;
    PatchPt = pcVar4;
  }
  including = '\0';
  includenotext = 0;
LAB_004b57c3:
  iVar8 = GetLine();
  return iVar8;
}

Assistant:

static int DoInclude (int dummy)
{
	char *data;
	int savedversion, savepversion, savepatchsize;
	char *savepatchfile, *savepatchpt, *savepatchname;

	if (including)
	{
		Printf ("Sorry, can't nest includes\n");
		return GetLine();
	}

	if (strnicmp (Line2, "notext", 6) == 0 && Line2[6] != 0 && isspace(Line2[6]))
	{
		includenotext = true;
		Line2 = skipwhite (Line2+7);
	}

	stripwhite (Line2);
	if (*Line2 == '\"')
	{
		data = ++Line2;
		while (*data && *data != '\"')
			data++;
		*data = 0;
	}

	if (*Line2 == 0)
	{
		Printf ("Include directive is missing filename\n");
	}
	else
	{
		data = Line2;
		DPrintf (DMSG_SPAMMY, "Including %s\n", data);
		savepatchname = PatchName;
		savepatchfile = PatchFile;
		savepatchpt = PatchPt;
		savepatchsize = PatchSize;
		savedversion = dversion;
		savepversion = pversion;
		including = true;

		// Try looking for the included file in the same directory
		// as the patch before looking in the current file.
		const char *lastSlash = savepatchname ? strrchr (savepatchname, '/') : NULL;
		char *path = data;

		if (lastSlash != NULL)
		{
			size_t pathlen = lastSlash - savepatchname + strlen (data) + 2;
			path = new char[pathlen];
			strncpy (path, savepatchname, (lastSlash - savepatchname) + 1);
			strcpy (path + (lastSlash - savepatchname) + 1, data);
			if (!FileExists (path))
			{
				delete[] path;
				path = data;
			}
		}

		D_LoadDehFile(path);

		if (data != path)
		{
			delete[] path;
		}

		DPrintf (DMSG_SPAMMY, "Done with include\n");
		PatchName = savepatchname;
		PatchFile = savepatchfile;
		PatchPt = savepatchpt;
		PatchSize = savepatchsize;
		dversion = savedversion;
		pversion = savepversion;
	}

	including = false;
	includenotext = false;
	return GetLine();
}